

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O3

SAT * CompoundFile::loadSSAT(SAT *__return_storage_ptr__,Header *header,istream *stream,SAT *sat)

{
  Header *pHVar1;
  long lVar2;
  int iVar3;
  pointer pSVar4;
  int32_t secID;
  uint uVar5;
  int iVar6;
  char c;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> ssat;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> chain;
  SecID local_8c;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> local_88;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> local_68;
  SAT *local_50;
  Header *local_48;
  pointer local_40;
  pointer local_38;
  
  local_88.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._M_finish = (SecID *)0x0;
  local_88.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (SecID *)0x0;
  uVar5 = (header->m_ssatFirstSecID).m_id;
  if (uVar5 != 0xfffffffe) {
    local_8c.m_id = uVar5;
    SAT::sectors(&local_68,sat,&local_8c);
    local_40 = local_68.
               super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl
               .super__Vector_impl_data._M_finish;
    if (local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pSVar4 = local_68.
               super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl
               .super__Vector_impl_data._M_start;
      local_50 = __return_storage_ptr__;
      local_48 = header;
      do {
        pHVar1 = local_48;
        local_38 = pSVar4;
        std::istream::seekg(stream,(long)pSVar4->m_id * (long)local_48->m_sectorSize + 0x200,0);
        iVar3 = pHVar1->m_sectorSize;
        iVar6 = iVar3 + 3;
        if (-1 < iVar3) {
          iVar6 = iVar3;
        }
        if (3 < iVar3) {
          iVar3 = 0;
          do {
            lVar2 = 0;
            uVar5 = 0;
            do {
              local_8c.m_id = local_8c.m_id & 0xffffff00;
              std::istream::get((char *)stream);
              uVar5 = uVar5 | (local_8c.m_id & 0xffU) << ((byte)lVar2 & 0x1f);
              lVar2 = lVar2 + 8;
            } while (lVar2 != 0x20);
            local_8c.m_id = uVar5;
            if (local_88.
                super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_88.
                super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::
              _M_realloc_insert<CompoundFile::SecID>
                        (&local_88,
                         (iterator)
                         local_88.
                         super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_8c);
            }
            else {
              (local_88.
               super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl
               .super__Vector_impl_data._M_finish)->m_id = uVar5;
              local_88.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_88.
                   super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            iVar3 = iVar3 + 1;
          } while (iVar3 != iVar6 >> 2);
        }
        pSVar4 = local_38 + 1;
        __return_storage_ptr__ = local_50;
      } while (pSVar4 != local_40);
    }
    if (local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::vector
            (&__return_storage_ptr__->m_sat,&local_88);
  if (local_88.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

inline SAT
loadSSAT( const Header & header, std::istream & stream,
	const SAT & sat )
{
	std::vector< SecID > ssat;

	if( header.ssatFirstSecID() != SecID::EndOfChain )
	{
		std::vector< SecID > chain = sat.sectors( header.ssatFirstSecID() );

		for( std::vector< SecID >::const_iterator it = chain.begin(),
			last = chain.end(); it != last; ++it )
		{
			stream.seekg( calcFileOffset( *it, header.sectorSize() ) );

			loadSATSector( stream, ssat, header.sectorSize() );
		}
	}

	return SAT( ssat );
}